

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O0

void __thiscall TPZMatrix<long>::Identity(TPZMatrix<long> *this)

{
  long lVar1;
  int64_t iVar2;
  int64_t iVar3;
  TPZBaseMatrix *in_RDI;
  int64_t col;
  int64_t row;
  char *in_stack_000001b8;
  char *in_stack_000001c0;
  undefined8 local_28;
  undefined8 local_20;
  long local_18;
  long local_10;
  
  iVar2 = TPZBaseMatrix::Cols(in_RDI);
  iVar3 = TPZBaseMatrix::Rows(in_RDI);
  if (iVar2 != iVar3) {
    Error(in_stack_000001c0,in_stack_000001b8);
  }
  local_10 = 0;
  while( true ) {
    lVar1 = local_10;
    iVar2 = TPZBaseMatrix::Rows(in_RDI);
    if (iVar2 <= lVar1) break;
    local_18 = 0;
    while( true ) {
      lVar1 = local_18;
      iVar2 = TPZBaseMatrix::Cols(in_RDI);
      if (iVar2 <= lVar1) break;
      if (local_10 == local_18) {
        local_20 = 1;
        (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x23])(in_RDI,local_10,local_18,&local_20);
      }
      else {
        local_28 = 0;
        (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x23])(in_RDI,local_10,local_18,&local_28);
      }
      local_18 = local_18 + 1;
    }
    local_10 = local_10 + 1;
  }
  return;
}

Assistant:

void TPZMatrix<TVar>::Identity() {
	
    if ( Cols() != Rows() ) {
        Error( "identity (TPZMatrix<>*) <TPZMatrix<>must be square>" );
    }
    for ( int64_t row = 0; row < Rows(); row++) {
        for ( int64_t col = 0; col < Cols(); col++ ) {
            (row == col)? PutVal(row,col,1.):PutVal(row,col,0.);
        }
    }
}